

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void lhash_page_release(void *pUserData)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  void *pChunk;
  
  lVar1 = *pUserData;
  lVar2 = *(long *)((long)pUserData + 8);
  if (*(int *)((long)pUserData + 0x38) != 0) {
    uVar4 = 0;
    pChunk = *(void **)((long)pUserData + 0x28);
    do {
      pvVar3 = *(void **)((long)pChunk + 0x60);
      SyBlobRelease((SyBlob *)((long)pChunk + 0x40));
      SyMemBackendPoolFree((SyMemBackend *)(lVar1 + 8),pChunk);
      uVar4 = uVar4 + 1;
      pChunk = pvVar3;
    } while (uVar4 < *(uint *)((long)pUserData + 0x38));
  }
  if (*(void **)((long)pUserData + 0x20) != (void *)0x0) {
    SyMemBackendFree((SyMemBackend *)(lVar1 + 8),*(void **)((long)pUserData + 0x20));
  }
  SyMemBackendPoolFree((SyMemBackend *)(lVar1 + 8),pUserData);
  *(undefined8 *)(lVar2 + 8) = 0;
  return;
}

Assistant:

static void lhash_page_release(void *pUserData)
{
	lhpage *pPage = (lhpage *)pUserData;
	lhash_kv_engine *pEngine = pPage->pHash;
	lhcell *pNext,*pCell = pPage->pList;
	unqlite_page *pRaw = pPage->pRaw;
	sxu32 n;
	/* Drop in-memory cells */
	for( n = 0 ; n < pPage->nCell ; ++n ){
		pNext = pCell->pNext;
		SyBlobRelease(&pCell->sKey);
		/* Release the cell instance */
		SyMemBackendPoolFree(&pEngine->sAllocator,(void *)pCell);
		/* Point to the next entry */
		pCell = pNext;
	}
	if( pPage->apCell ){
		/* Release the cell table */
		SyMemBackendFree(&pEngine->sAllocator,(void *)pPage->apCell);
	}
	/* Finally, release the whole page */
	SyMemBackendPoolFree(&pEngine->sAllocator,pPage);
	pRaw->pUserData = 0;
}